

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputPFBDecodeStream.cpp
# Opt level: O0

void __thiscall InputPFBDecodeStream::ResetReadStatus(InputPFBDecodeStream *this)

{
  EStatusCode EVar1;
  InputPFBDecodeStream *this_local;
  
  this->mInSegmentReadIndex = 0;
  this->mSegmentSize = 0;
  this->mCurrentType = '\0';
  this->mHasTokenBuffer = false;
  this->mFoundEOF = false;
  EVar1 = eFailure;
  if (this->mStreamToDecode != (IByteReader *)0x0) {
    EVar1 = eSuccess;
  }
  this->mInternalState = EVar1;
  return;
}

Assistant:

void InputPFBDecodeStream::ResetReadStatus()
{
	mInSegmentReadIndex = 0;
	mSegmentSize = 0;
	mCurrentType = 0;
	mHasTokenBuffer = false;
	mFoundEOF = false;
	mInternalState = (mStreamToDecode != NULL) ? PDFHummus::eSuccess:PDFHummus::eFailure;
}